

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O0

int __thiscall ncnn::Padding::forward(Padding *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  unsigned_short uVar6;
  float *pfVar7;
  int iVar8;
  int iVar9;
  long in_RCX;
  long in_RSI;
  long in_RDI;
  Mat m_1;
  int z_;
  Mat borderm_1;
  int z;
  float pad_value_1;
  int q_1;
  int outd;
  Mat m;
  int q_;
  float pad_value;
  Mat borderm;
  int q;
  int outc;
  int outh;
  int outw;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  undefined4 in_stack_fffffffffffffd10;
  int in_stack_fffffffffffffd14;
  undefined4 in_stack_fffffffffffffd18;
  undefined2 in_stack_fffffffffffffd1c;
  undefined1 in_stack_fffffffffffffd1e;
  char in_stack_fffffffffffffd1f;
  unsigned_short in_stack_fffffffffffffd20;
  unsigned_short in_stack_fffffffffffffd22;
  int in_stack_fffffffffffffd24;
  int in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd2c;
  undefined4 in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd34;
  undefined2 in_stack_fffffffffffffd38;
  unsigned_short in_stack_fffffffffffffd3a;
  unsigned_short in_stack_fffffffffffffd3c;
  unsigned_short in_stack_fffffffffffffd3e;
  Allocator *in_stack_fffffffffffffd40;
  float in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  float value;
  float type;
  int in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd54;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  undefined4 in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd64;
  int local_298;
  float local_28c;
  int local_110;
  int local_108;
  int local_58;
  int local_4;
  
  if (((((*(int *)(in_RDI + 0xd0) == 0) && (*(int *)(in_RDI + 0xd4) == 0)) &&
       (*(int *)(in_RDI + 0xd8) == 0)) &&
      ((*(int *)(in_RDI + 0xdc) == 0 && (*(int *)(in_RDI + 0xe8) == 0)))) &&
     (*(int *)(in_RDI + 0xec) == 0)) {
    ncnn::Mat::operator=
              ((Mat *)CONCAT17(in_stack_fffffffffffffd1f,
                               CONCAT16(in_stack_fffffffffffffd1e,
                                        CONCAT24(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18
                                                ))),
               (Mat *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    local_4 = 0;
  }
  else {
    iVar1 = *(int *)(in_RSI + 0x34);
    iVar2 = *(int *)(in_RSI + 0x38);
    iVar3 = *(int *)(in_RSI + 0x28);
    lVar4 = *(long *)(in_RSI + 0x10);
    if (iVar3 == 1) {
      ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                        in_stack_fffffffffffffd2c,
                        CONCAT44(in_stack_fffffffffffffd24,
                                 CONCAT22(in_stack_fffffffffffffd22,in_stack_fffffffffffffd20)),
                        (Allocator *)
                        CONCAT17(in_stack_fffffffffffffd1f,
                                 CONCAT16(in_stack_fffffffffffffd1e,
                                          CONCAT24(in_stack_fffffffffffffd1c,
                                                   in_stack_fffffffffffffd18))));
      bVar5 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10))
      ;
      if (bVar5) {
        local_4 = -100;
      }
      else {
        if (lVar4 == 1) {
          copy_make_border_image<signed_char>
                    ((Mat *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     (Mat *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     in_stack_fffffffffffffd54,in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
                     (char)((uint)in_stack_fffffffffffffd48 >> 0x18));
        }
        if (lVar4 == 2) {
          if (((*(byte *)(in_RDI + 0xd) & 1) == 0) || ((*(byte *)(in_RCX + 0x22) & 1) == 0)) {
            float32_to_bfloat16(*(float *)(in_RDI + 0xe4));
          }
          else {
            float32_to_float16(*(float *)(in_RDI + 0xe4));
          }
          copy_make_border_image<unsigned_short>
                    ((Mat *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     (Mat *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     in_stack_fffffffffffffd54,in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
                     (unsigned_short)((uint)in_stack_fffffffffffffd48 >> 0x10));
        }
        if (lVar4 == 4) {
          copy_make_border_image<float>
                    ((Mat *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     (Mat *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     in_stack_fffffffffffffd54,in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
                     in_stack_fffffffffffffd48);
        }
        local_4 = 0;
      }
    }
    else if (iVar3 == 2) {
      ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                        in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28,
                        CONCAT44(in_stack_fffffffffffffd24,
                                 CONCAT22(in_stack_fffffffffffffd22,in_stack_fffffffffffffd20)),
                        (Allocator *)
                        CONCAT17(in_stack_fffffffffffffd1f,
                                 CONCAT16(in_stack_fffffffffffffd1e,
                                          CONCAT24(in_stack_fffffffffffffd1c,
                                                   in_stack_fffffffffffffd18))));
      bVar5 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10))
      ;
      if (bVar5) {
        local_4 = -100;
      }
      else {
        if (lVar4 == 1) {
          copy_make_border_image<signed_char>
                    ((Mat *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     (Mat *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     in_stack_fffffffffffffd54,in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
                     (char)((uint)in_stack_fffffffffffffd48 >> 0x18));
        }
        if (lVar4 == 2) {
          if (((*(byte *)(in_RDI + 0xd) & 1) == 0) || ((*(byte *)(in_RCX + 0x22) & 1) == 0)) {
            float32_to_bfloat16(*(float *)(in_RDI + 0xe4));
          }
          else {
            float32_to_float16(*(float *)(in_RDI + 0xe4));
          }
          copy_make_border_image<unsigned_short>
                    ((Mat *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     (Mat *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     in_stack_fffffffffffffd54,in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
                     (unsigned_short)((uint)in_stack_fffffffffffffd48 >> 0x10));
        }
        if (lVar4 == 4) {
          copy_make_border_image<float>
                    ((Mat *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     (Mat *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     in_stack_fffffffffffffd54,in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
                     in_stack_fffffffffffffd48);
        }
        local_4 = 0;
      }
    }
    else if (iVar3 == 3) {
      iVar1 = *(int *)(in_RDI + 0xe8);
      iVar3 = *(int *)(in_RDI + 0xec);
      ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                        in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28,
                        in_stack_fffffffffffffd24,
                        CONCAT17(in_stack_fffffffffffffd1f,
                                 CONCAT16(in_stack_fffffffffffffd1e,
                                          CONCAT24(in_stack_fffffffffffffd1c,
                                                   in_stack_fffffffffffffd18))),
                        (Allocator *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
      bVar5 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10))
      ;
      if (bVar5) {
        local_4 = -100;
      }
      else {
        for (local_58 = 0; local_58 < iVar2 + iVar1 + iVar3; local_58 = local_58 + 1) {
          ncnn::Mat::channel((Mat *)CONCAT26(in_stack_fffffffffffffd3e,
                                             CONCAT24(in_stack_fffffffffffffd3c,
                                                      CONCAT22(in_stack_fffffffffffffd3a,
                                                               in_stack_fffffffffffffd38))),
                             in_stack_fffffffffffffd34);
          if (*(int *)(in_RDI + 0xf0) == 0) {
            local_28c = *(float *)(in_RDI + 0xe4);
            local_298 = in_stack_fffffffffffffd64;
          }
          else {
            pfVar7 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xf8),(long)local_58);
            local_28c = *pfVar7;
            local_298 = in_stack_fffffffffffffd64;
          }
          if (((local_58 < *(int *)(in_RDI + 0xe8)) || (iVar2 + *(int *)(in_RDI + 0xe8) <= local_58)
              ) && (*(int *)(in_RDI + 0xe0) == 0)) {
            if (lVar4 == 1) {
              ncnn::Mat::fill<signed_char>
                        ((Mat *)CONCAT44(in_stack_fffffffffffffd24,
                                         CONCAT22(in_stack_fffffffffffffd22,
                                                  in_stack_fffffffffffffd20)),
                         in_stack_fffffffffffffd1f);
            }
            if (lVar4 == 2) {
              if (((*(byte *)(in_RDI + 0xd) & 1) == 0) || ((*(byte *)(in_RCX + 0x22) & 1) == 0)) {
                float32_to_bfloat16(local_28c);
              }
              else {
                float32_to_float16(local_28c);
              }
              ncnn::Mat::fill<unsigned_short>
                        ((Mat *)CONCAT44(in_stack_fffffffffffffd24,
                                         CONCAT22(in_stack_fffffffffffffd22,
                                                  in_stack_fffffffffffffd20)),
                         CONCAT11(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd1e));
            }
            if (lVar4 == 4) {
              ncnn::Mat::fill((Mat *)CONCAT44(in_stack_fffffffffffffd24,
                                              CONCAT22(in_stack_fffffffffffffd22,
                                                       in_stack_fffffffffffffd20)),
                              (float)CONCAT13(in_stack_fffffffffffffd1f,
                                              CONCAT12(in_stack_fffffffffffffd1e,
                                                       in_stack_fffffffffffffd1c)));
            }
          }
          else {
            iVar8 = local_58 - *(int *)(in_RDI + 0xe8);
            if (*(int *)(in_RDI + 0xe0) == 1) {
              local_298 = iVar8;
              if (iVar8 < 1) {
                local_298 = 0;
              }
              if (iVar2 + -1 <= local_298) {
                local_298 = iVar2 + -1;
              }
            }
            ncnn::Mat::channel((Mat *)CONCAT26(in_stack_fffffffffffffd3e,
                                               CONCAT24(in_stack_fffffffffffffd3c,
                                                        CONCAT22(in_stack_fffffffffffffd3a,
                                                                 in_stack_fffffffffffffd38))),
                               in_stack_fffffffffffffd34);
            if (lVar4 == 1) {
              copy_make_border_image<signed_char>
                        ((Mat *)CONCAT44(local_298,in_stack_fffffffffffffd60),
                         (Mat *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                         in_stack_fffffffffffffd54,in_stack_fffffffffffffd50,
                         in_stack_fffffffffffffd4c,(char)((uint)in_stack_fffffffffffffd48 >> 0x18));
            }
            if (lVar4 == 2) {
              in_stack_fffffffffffffd58 = *(undefined4 *)(in_RDI + 0xd0);
              in_stack_fffffffffffffd5c = *(undefined4 *)(in_RDI + 0xd8);
              in_stack_fffffffffffffd60 = *(undefined4 *)(in_RDI + 0xe0);
              if (((*(byte *)(in_RDI + 0xd) & 1) == 0) || ((*(byte *)(in_RCX + 0x22) & 1) == 0)) {
                uVar6 = float32_to_bfloat16(local_28c);
                in_stack_fffffffffffffd50 = CONCAT22(uVar6,(short)in_stack_fffffffffffffd50);
                in_stack_fffffffffffffd54 =
                     CONCAT22((short)((uint)in_stack_fffffffffffffd54 >> 0x10),uVar6);
              }
              else {
                uVar6 = float32_to_float16(local_28c);
                in_stack_fffffffffffffd54 = CONCAT22(uVar6,uVar6);
              }
              copy_make_border_image<unsigned_short>
                        ((Mat *)CONCAT44(local_298,in_stack_fffffffffffffd60),
                         (Mat *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                         in_stack_fffffffffffffd54,in_stack_fffffffffffffd50,
                         in_stack_fffffffffffffd4c,
                         (unsigned_short)((uint)in_stack_fffffffffffffd48 >> 0x10));
            }
            if (lVar4 == 4) {
              copy_make_border_image<float>
                        ((Mat *)CONCAT44(local_298,in_stack_fffffffffffffd60),
                         (Mat *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                         in_stack_fffffffffffffd54,in_stack_fffffffffffffd50,
                         in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48);
            }
            ncnn::Mat::~Mat((Mat *)0x68ea4d);
          }
          ncnn::Mat::~Mat((Mat *)0x68ea5a);
          in_stack_fffffffffffffd64 = local_298;
        }
        local_4 = 0;
      }
    }
    else if (iVar3 == 4) {
      iVar3 = *(int *)(in_RDI + 0xe8);
      iVar8 = *(int *)(in_RDI + 0xec);
      ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                        in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28,
                        in_stack_fffffffffffffd24,
                        CONCAT22(in_stack_fffffffffffffd22,in_stack_fffffffffffffd20),
                        CONCAT17(in_stack_fffffffffffffd1f,
                                 CONCAT16(in_stack_fffffffffffffd1e,
                                          CONCAT24(in_stack_fffffffffffffd1c,
                                                   in_stack_fffffffffffffd18))),
                        in_stack_fffffffffffffd40);
      bVar5 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10))
      ;
      if (bVar5) {
        local_4 = -100;
      }
      else {
        for (local_108 = 0; local_108 < iVar2; local_108 = local_108 + 1) {
          if (*(int *)(in_RDI + 0xf0) == 0) {
            value = *(float *)(in_RDI + 0xe4);
          }
          else {
            pfVar7 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xf8),(long)local_108);
            value = *pfVar7;
          }
          type = value;
          for (local_110 = 0; local_110 < iVar1 + iVar3 + iVar8; local_110 = local_110 + 1) {
            ncnn::Mat::channel((Mat *)CONCAT26(in_stack_fffffffffffffd3e,
                                               CONCAT24(in_stack_fffffffffffffd3c,
                                                        CONCAT22(in_stack_fffffffffffffd3a,
                                                                 in_stack_fffffffffffffd38))),
                               in_stack_fffffffffffffd34);
            ncnn::Mat::depth((Mat *)CONCAT17(in_stack_fffffffffffffd1f,
                                             CONCAT16(in_stack_fffffffffffffd1e,
                                                      CONCAT24(in_stack_fffffffffffffd1c,
                                                               in_stack_fffffffffffffd18))),
                             in_stack_fffffffffffffd14);
            ncnn::Mat::~Mat((Mat *)0x68ec0c);
            if (((local_110 < *(int *)(in_RDI + 0xe8)) ||
                (iVar1 + *(int *)(in_RDI + 0xe8) <= local_110)) && (*(int *)(in_RDI + 0xe0) == 0)) {
              if (lVar4 == 1) {
                ncnn::Mat::fill<signed_char>
                          ((Mat *)CONCAT44(in_stack_fffffffffffffd24,
                                           CONCAT22(in_stack_fffffffffffffd22,
                                                    in_stack_fffffffffffffd20)),
                           in_stack_fffffffffffffd1f);
              }
              if (lVar4 == 2) {
                if (((*(byte *)(in_RDI + 0xd) & 1) == 0) || ((*(byte *)(in_RCX + 0x22) & 1) == 0)) {
                  in_stack_fffffffffffffd3a = float32_to_bfloat16(value);
                  in_stack_fffffffffffffd3c = in_stack_fffffffffffffd3a;
                }
                else {
                  in_stack_fffffffffffffd3e = float32_to_float16(value);
                  in_stack_fffffffffffffd3c = in_stack_fffffffffffffd3e;
                }
                ncnn::Mat::fill<unsigned_short>
                          ((Mat *)CONCAT44(in_stack_fffffffffffffd24,
                                           CONCAT22(in_stack_fffffffffffffd22,
                                                    in_stack_fffffffffffffd20)),
                           CONCAT11(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd1e));
              }
              if (lVar4 == 4) {
                ncnn::Mat::fill((Mat *)CONCAT44(in_stack_fffffffffffffd24,
                                                CONCAT22(in_stack_fffffffffffffd22,
                                                         in_stack_fffffffffffffd20)),
                                (float)CONCAT13(in_stack_fffffffffffffd1f,
                                                CONCAT12(in_stack_fffffffffffffd1e,
                                                         in_stack_fffffffffffffd1c)));
              }
            }
            else {
              iVar9 = local_110 - *(int *)(in_RDI + 0xe8);
              if ((*(int *)(in_RDI + 0xe0) == 1) && (in_stack_fffffffffffffd34 = iVar9, iVar9 < 1))
              {
                in_stack_fffffffffffffd34 = 0;
              }
              ncnn::Mat::channel((Mat *)CONCAT26(in_stack_fffffffffffffd3e,
                                                 CONCAT24(in_stack_fffffffffffffd3c,
                                                          CONCAT22(in_stack_fffffffffffffd3a,
                                                                   in_stack_fffffffffffffd38))),
                                 in_stack_fffffffffffffd34);
              ncnn::Mat::depth((Mat *)CONCAT17(in_stack_fffffffffffffd1f,
                                               CONCAT16(in_stack_fffffffffffffd1e,
                                                        CONCAT24(in_stack_fffffffffffffd1c,
                                                                 in_stack_fffffffffffffd18))),
                               in_stack_fffffffffffffd14);
              ncnn::Mat::~Mat((Mat *)0x68ee93);
              if (lVar4 == 1) {
                copy_make_border_image<signed_char>
                          ((Mat *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                           (Mat *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                           in_stack_fffffffffffffd54,in_stack_fffffffffffffd50,(int)type,
                           (char)((uint)in_stack_fffffffffffffd48 >> 0x18));
              }
              if (lVar4 == 2) {
                in_stack_fffffffffffffd24 = *(int *)(in_RDI + 0xd0);
                if (((*(byte *)(in_RDI + 0xd) & 1) == 0) || ((*(byte *)(in_RCX + 0x22) & 1) == 0)) {
                  in_stack_fffffffffffffd20 = float32_to_bfloat16(value);
                  in_stack_fffffffffffffd1e = (undefined1)in_stack_fffffffffffffd20;
                  in_stack_fffffffffffffd1f = (char)(in_stack_fffffffffffffd20 >> 8);
                }
                else {
                  in_stack_fffffffffffffd20 = float32_to_float16(value);
                  in_stack_fffffffffffffd22 = in_stack_fffffffffffffd20;
                }
                copy_make_border_image<unsigned_short>
                          ((Mat *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                           (Mat *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                           in_stack_fffffffffffffd54,in_stack_fffffffffffffd50,(int)type,
                           (unsigned_short)((uint)in_stack_fffffffffffffd48 >> 0x10));
              }
              if (lVar4 == 4) {
                copy_make_border_image<float>
                          ((Mat *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                           (Mat *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                           in_stack_fffffffffffffd54,in_stack_fffffffffffffd50,(int)type,
                           in_stack_fffffffffffffd48);
              }
              ncnn::Mat::~Mat((Mat *)0x68f03e);
            }
            ncnn::Mat::~Mat((Mat *)0x68f04b);
          }
        }
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Padding::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w + left + right;

    if (dims == 1)
    {
        top_blob.create(outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, 0, left, type, static_cast<signed char>(value));
        if (elemsize == 2)
            copy_make_border_image<unsigned short>(bottom_blob, top_blob, 0, left, type, support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(value) : float32_to_bfloat16(value));
        if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, 0, left, type, value);

        return 0;
    }

    int outh = h + top + bottom;

    if (dims == 2)
    {
        top_blob.create(outw, outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, top, left, type, static_cast<signed char>(value));
        if (elemsize == 2)
            copy_make_border_image<unsigned short>(bottom_blob, top_blob, top, left, type, support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(value) : float32_to_bfloat16(value));
        if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, top, left, type, value);

        return 0;
    }

    if (dims == 3)
    {
        int outc = channels + front + behind;

        top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < outc; q++)
        {
            Mat borderm = top_blob.channel(q);

            float pad_value = per_channel_pad_data_size ? per_channel_pad_data[q] : value;

            //Channel padding
            if (((q < front) || (q >= (channels + front))) && type == 0)
            {
                if (elemsize == 1)
                {
                    borderm.fill(static_cast<signed char>(pad_value));
                }
                if (elemsize == 2)
                {
                    borderm.fill(support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(pad_value) : float32_to_bfloat16(pad_value));
                }
                if (elemsize == 4)
                {
                    borderm.fill(pad_value);
                }
            }
            else
            {
                int q_ = q - front;

                if (type == 1)
                {
                    q_ = q_ <= 0 ? 0 : q_;
                    q_ = q_ >= channels - 1 ? channels - 1 : q_;
                }
                if (type == 2)
                {
                    q_ = abs(q_);
                    q_ = (channels - 1) - abs(q_ - (channels - 1));
                }
                const Mat m = bottom_blob.channel(q_);
                if (elemsize == 1)
                    copy_make_border_image<signed char>(m, borderm, top, left, type, static_cast<signed char>(pad_value));
                if (elemsize == 2)
                    copy_make_border_image<unsigned short>(m, borderm, top, left, type, support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(pad_value) : float32_to_bfloat16(pad_value));
                if (elemsize == 4)
                    copy_make_border_image<float>(m, borderm, top, left, type, pad_value);
            }
        }

        return 0;
    }

    if (dims == 4)
    {
        int outd = d + front + behind;

        top_blob.create(outw, outh, outd, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float pad_value = per_channel_pad_data_size ? per_channel_pad_data[q] : value;

            for (int z = 0; z < outd; z++)
            {
                Mat borderm = top_blob.channel(q).depth(z);

                // depth padding
                if (((z < front) || (z >= (d + front))) && type == 0)
                {
                    if (elemsize == 1)
                    {
                        borderm.fill(static_cast<signed char>(pad_value));
                    }
                    if (elemsize == 2)
                    {
                        borderm.fill(support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(pad_value) : float32_to_bfloat16(pad_value));
                    }
                    if (elemsize == 4)
                    {
                        borderm.fill(pad_value);
                    }
                }
                else
                {
                    int z_ = z - front;

                    if (type == 1)
                    {
                        z_ = z_ <= 0 ? 0 : z_;
                        z_ = z_ >= d - 1 ? d - 1 : z_;
                    }
                    if (type == 2)
                    {
                        z_ = abs(z_);
                        z_ = (d - 1) - abs(z_ - (d - 1));
                    }
                    const Mat m = bottom_blob.channel(q).depth(z_);
                    if (elemsize == 1)
                        copy_make_border_image<signed char>(m, borderm, top, left, type, static_cast<signed char>(pad_value));
                    if (elemsize == 2)
                        copy_make_border_image<unsigned short>(m, borderm, top, left, type, support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(pad_value) : float32_to_bfloat16(pad_value));
                    if (elemsize == 4)
                        copy_make_border_image<float>(m, borderm, top, left, type, pad_value);
                }
            }
        }

        return 0;
    }

    return 0;
}